

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_ShmtBase.cpp
# Opt level: O0

bool __thiscall axl::io::ShmtBase::ensureMappingSize(ShmtBase *this,size_t size)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  Module *this_00;
  SystemInfo *pSVar4;
  unsigned_long uVar5;
  uint64_t uVar6;
  undefined4 extraout_var;
  ulong in_RSI;
  File *in_RDI;
  void *p;
  bool result;
  SystemInfo *systemInfo;
  unsigned_long size_00;
  bool local_1;
  
  sVar3 = Mapping::getSize((Mapping *)(in_RDI + 2));
  if (sVar3 < in_RSI) {
    this_00 = g::getModule();
    pSVar4 = g::Module::getSystemInfo(this_00);
    uVar5 = sl::align<unsigned_long>(in_RSI,pSVar4->m_pageSize);
    sys::atomicLock((int32_t *)in_RDI);
    size_00 = uVar5;
    uVar6 = File::getSize((File *)0x14a978);
    if (uVar6 < size_00) {
      bVar1 = File::setSize(in_RDI,size_00);
      sys::atomicUnlock((int32_t *)in_RDI);
      if (!bVar1) {
        return false;
      }
    }
    else {
      sys::atomicUnlock((int32_t *)in_RDI);
    }
    iVar2 = Mapping::open((Mapping *)(in_RDI + 2),(char *)(in_RDI + 1),0,uVar5,0);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      local_1 = false;
    }
    else {
      *(long *)(in_RDI + 0x14) = CONCAT44(extraout_var,iVar2);
      *(long *)(in_RDI + 0x16) = *(long *)(in_RDI + 0x14) + 0x28;
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool
ShmtBase::ensureMappingSize(size_t size) {
	if (size <= m_mapping.getSize())
		return true;

	const g::SystemInfo* systemInfo = g::getModule()->getSystemInfo();
	size = sl::align(size, systemInfo->m_pageSize);

#if (_AXL_OS_POSIX)
	sys::atomicLock(&m_hdr->m_lock);
	if (size <= m_file.getSize()) {
		sys::atomicUnlock(&m_hdr->m_lock);
	} else {
		bool result = m_file.setSize(size);
		sys::atomicUnlock(&m_hdr->m_lock);
		if (!result)
			return false;
	}
#endif

	void* p = m_mapping.open(&m_file, 0, size);
	if (!p)
		return false;

	m_hdr = (ShmtFileHdr*)p;
	m_data = (char*)(m_hdr + 1);
	return true;
}